

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrowHandler.cpp
# Opt level: O1

ArrowOpt __thiscall yb::ArrowHandler::handle(ArrowHandler *this,uchar c)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  ArrowOpt AVar4;
  undefined7 in_register_00000031;
  long lVar6;
  long *plVar7;
  bool bVar8;
  size_type *local_60;
  type ec;
  ArrowOpt AVar5;
  
  lVar6 = CONCAT71(in_register_00000031,c);
  ec.field_2._8_8_ = this;
  std::__cxx11::string::push_back(c + '@');
  plVar7 = *(long **)(lVar6 + 0x18);
  bVar8 = plVar7 == (long *)0x0;
  if (!bVar8) {
    do {
      lVar1 = plVar7[1];
      local_60 = &ec._M_string_length;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,plVar7[2],plVar7[3] + plVar7[2])
      ;
      iVar2 = std::__cxx11::string::compare((ulong)&local_60,0,*(string **)(lVar6 + 0x48));
      if (iVar2 == 0) {
        uVar3 = 4;
        if (ec._M_dataplus._M_p == *(pointer *)(lVar6 + 0x48)) {
          *(undefined8 *)(lVar6 + 0x48) = 0;
          **(undefined1 **)(lVar6 + 0x40) = 0;
          uVar3 = (int)lVar1;
        }
        *(undefined4 *)ec.field_2._8_8_ = uVar3;
        *(undefined1 *)(ec.field_2._8_8_ + 4) = 1;
        if (local_60 != &ec._M_string_length) {
          operator_delete(local_60,ec._M_string_length + 1);
        }
        if (!bVar8) {
          AVar5.super__Optional_base<yb::Arrow,_false>.field_0 =
               (anon_union_4_2_e8b08be2_for__Optional_base<yb::Arrow,_false>_2)ec.field_2._8_4_;
          AVar5.super__Optional_base<yb::Arrow,_false>._M_engaged = (bool)ec.field_2._12_1_;
          AVar5.super__Optional_base<yb::Arrow,_false>._5_3_ = ec.field_2._13_3_;
          return (ArrowOpt)AVar5.super__Optional_base<yb::Arrow,_false>;
        }
        break;
      }
      if (local_60 != &ec._M_string_length) {
        operator_delete(local_60,ec._M_string_length + 1);
      }
      plVar7 = (long *)*plVar7;
      bVar8 = plVar7 == (long *)0x0;
    } while (!bVar8);
  }
  *(undefined8 *)(lVar6 + 0x48) = 0;
  **(undefined1 **)(lVar6 + 0x40) = 0;
  *(undefined8 *)ec.field_2._8_8_ = 0;
  *(undefined1 *)(ec.field_2._8_8_ + 4) = 0;
  AVar4.super__Optional_base<yb::Arrow,_false>.field_0 =
       (anon_union_4_2_e8b08be2_for__Optional_base<yb::Arrow,_false>_2)ec.field_2._8_4_;
  AVar4.super__Optional_base<yb::Arrow,_false>._M_engaged = (bool)ec.field_2._12_1_;
  AVar4.super__Optional_base<yb::Arrow,_false>._5_3_ = ec.field_2._13_3_;
  return (ArrowOpt)AVar4.super__Optional_base<yb::Arrow,_false>;
}

Assistant:

ArrowHandler::ArrowOpt ArrowHandler::handle(unsigned char c) {
    currentState_ += c;
    for (auto it = escapeCodes_.begin(); it != escapeCodes_.end(); ++it) {
        auto arrow = std::get<0>(*it);
        auto ec = std::get<1>(*it);
        if (ec.compare(0, currentState_.length(), currentState_) == 0) {
            if (ec.length() == currentState_.length()) {
                currentState_.clear();
                return arrow;
            }
            return Arrow::invalid;
        }
    }
    currentState_.clear();
    return {};
}